

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void SetAccessorRange<unsigned_char>
               (Ref<glTF::Accessor> acc,void *data,uint count,uint numCompsIn,uint numCompsOut)

{
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  Accessor *pAVar6;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double local_38;
  
  pvVar7 = acc.vector;
  if (numCompsOut <= numCompsIn) {
    uVar5 = acc._8_8_ & 0xffffffff;
    uVar8 = numCompsOut;
    while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
      local_38 = 1.79769313486232e+308;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar5]->min,&local_38);
      local_38 = -1.79769313486232e+308;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&(pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar5]->max,&local_38);
    }
    pvVar4 = (void *)((ulong)(count * numCompsIn) + (long)data);
    for (; data < pvVar4; data = (void *)((long)data + (ulong)numCompsIn)) {
      for (uVar3 = 0; numCompsOut != uVar3; uVar3 = uVar3 + 1) {
        dVar10 = (double)*(byte *)((long)data + uVar3);
        pAVar6 = (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar5];
        lVar2 = *(long *)&(pAVar6->min).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        if (dVar10 < *(double *)(lVar2 + uVar3 * 8)) {
          *(double *)(lVar2 + uVar3 * 8) = dVar10;
          pAVar6 = (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)
                   ._M_impl.super__Vector_impl_data._M_start[uVar5];
        }
        lVar2 = *(long *)&(pAVar6->max).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        pdVar1 = (double *)(lVar2 + uVar3 * 8);
        if (*pdVar1 <= dVar10 && dVar10 != *pdVar1) {
          *(double *)(lVar2 + uVar3 * 8) = dVar10;
        }
      }
    }
    return;
  }
  __assert_fail("numCompsOut <= numCompsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                ,0xb6,
                "void SetAccessorRange(Ref<Accessor>, void *, unsigned int, unsigned int, unsigned int) [T = unsigned char]"
               );
}

Assistant:

void SetAccessorRange(Ref<Accessor> acc, void* data, unsigned int count,
	unsigned int numCompsIn, unsigned int numCompsOut)
{
	ai_assert(numCompsOut <= numCompsIn);

	// Allocate and initialize with large values.
	for (unsigned int i = 0 ; i < numCompsOut ; i++) {
		acc->min.push_back( std::numeric_limits<double>::max());
		acc->max.push_back(-std::numeric_limits<double>::max());
	}

	size_t totalComps = count * numCompsIn;
	T* buffer_ptr = static_cast<T*>(data);
	T* buffer_end = buffer_ptr + totalComps;

	// Search and set extreme values.
	for (; buffer_ptr < buffer_end ; buffer_ptr += numCompsIn) {
		for (unsigned int j = 0 ; j < numCompsOut ; j++) {
			double valueTmp = buffer_ptr[j];

			if (valueTmp < acc->min[j]) {
				acc->min[j] = valueTmp;
			}
			if (valueTmp > acc->max[j]) {
				acc->max[j] = valueTmp;
			}
		}
	}
}